

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::initialVelocityProject
          (Projection *this,int c_lev,Real cur_divu_time,int have_divu,int init_vel_iter)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *pFVar2;
  pointer ppAVar3;
  AmrLevel *pAVar4;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar5;
  FabArrayBase *pFVar6;
  long *plVar7;
  char cVar8;
  pointer puVar9;
  bool bVar10;
  int iVar11;
  TimeCenter TVar12;
  MultiFab *this_00;
  NavierStokesBase *this_01;
  MultiFab *pMVar13;
  BARef *pBVar14;
  Print *pPVar15;
  pointer *ppbVar16;
  BARef *pBVar17;
  int iVar18;
  int iVar19;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar20;
  undefined8 extraout_RDX_09;
  int iVar21;
  int iVar22;
  pointer piVar23;
  long lVar24;
  BARef *pBVar25;
  undefined8 *puVar26;
  double dVar27;
  Real RVar28;
  int Divu_Type;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  int Divu;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  sig;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  MFIter mfi;
  int local_2bc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_2a8;
  undefined1 local_288 [8];
  pointer pBStack_280;
  undefined8 local_278;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_268;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  int local_224;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_220;
  pointer local_208;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_200;
  double local_1e8;
  _Bit_type *local_1e0;
  Real local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  int local_1a0;
  long *local_188;
  
  uVar1 = *(uint *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  piVar23 = (pointer)(ulong)uVar1;
  local_1d8 = cur_divu_time;
  if (init_vel_iter < 1) {
    if (c_lev <= (int)uVar1) {
      lVar24 = (long)c_lev;
      iVar11 = (uVar1 - c_lev) + 1;
      do {
        pFVar2 = *(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar24]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x1b0);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,
                   &(pFVar2->super_FabArrayBase).n_grow);
        pFVar2 = *(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar24]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x290);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,
                   &(pFVar2->super_FabArrayBase).n_grow);
        lVar24 = lVar24 + 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    if (verbose != 0) {
      local_1c8._8_8_ = amrex::OutStream();
      local_1c8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_1c8._0_4_ = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
      *(undefined8 *)
       ((long)&local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       (((BARef *)
        ((long)local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h._M_rehash_policy.
       _M_next_resize) =
           *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8,
                 "Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n"
                 ,0x53);
      amrex::Print::~Print((Print *)local_1c8);
    }
  }
  else {
    if (verbose != 0) {
      local_1c8._8_8_ = amrex::OutStream();
      local_1c8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_1c8._0_4_ = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
      *(undefined8 *)
       ((long)&local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       (((BARef *)
        ((long)local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h._M_rehash_policy.
       _M_next_resize) =
           *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8,"Projection::initialVelocityProject(): levels = ",0x2f);
      std::ostream::operator<<((ostringstream *)&local_1b8,c_lev);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"-",1);
      std::ostream::operator<<((ostringstream *)&local_1b8,uVar1);
      local_288[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,local_288,1);
      amrex::Print::~Print((Print *)local_1c8);
      if (rho_wgt_vel_proj == 0) {
        local_1c8._8_8_ = amrex::OutStream();
        local_1c8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_1c8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
        *(undefined8 *)
         ((long)&local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         (((BARef *)
          ((long)local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h._M_rehash_policy.
         _M_next_resize) =
             *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n",0x2d);
      }
      else {
        local_1c8._8_8_ = amrex::OutStream();
        local_1c8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_1c8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
        *(undefined8 *)
         ((long)&local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         (((BARef *)
          ((long)local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h._M_rehash_policy.
         _M_next_resize) =
             *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"RHO WEIGHTED INITIAL VELOCITY PROJECTION\n",0x29);
      }
      amrex::Print::~Print((Print *)local_1c8);
    }
    if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
    local_1e8 = amrex::ParallelDescriptor::second();
    local_288 = (undefined1  [8])0x0;
    pBStack_280 = (pointer)0x0;
    local_278 = 0;
    local_288 = (undefined1  [8])operator_new(0x50);
    pBStack_280 = (pointer)&((pointer)((long)local_288 + 0x38))->btype;
    *(_func_int **)((((pointer)((long)local_288 + 0x38))->smallend).vect + 2) = (_func_int *)0x0;
    (((pointer)((long)local_288 + 0x38))->bigend).vect[1] = 0;
    (((pointer)((long)local_288 + 0x38))->bigend).vect[2] = 0;
    *(undefined8 *)((((pointer)((long)local_288 + 0x1c))->bigend).vect + 2) = 0;
    *(_func_int **)(((pointer)((long)local_288 + 0x38))->smallend).vect = (_func_int *)0x0;
    *(undefined8 *)((((pointer)((long)local_288 + 0x1c))->smallend).vect + 1) = 0;
    (((Box *)((long)local_288 + 0x1c))->bigend).vect[0] = 0;
    (((Box *)((long)local_288 + 0x1c))->bigend).vect[1] = 0;
    *(undefined8 *)((((pointer)local_288)->bigend).vect + 1) = 0;
    *(undefined8 *)&((pointer)local_288)->btype = 0;
    *(_func_int ***)(((pointer)local_288)->smallend).vect = (_func_int **)0x0;
    *(_func_int **)((long)(((pointer)local_288)->smallend).vect + 8) = (_func_int *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278 = pBStack_280;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_start + 10;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[8] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[9] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[6] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[7] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[4] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[5] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[3] = (MultiFab *)0x0;
    *local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
     super__Vector_impl_data._M_start = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (MultiFab *)0x0;
    local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::vector(&local_220,10,(allocator_type *)local_1c8);
    iVar11 = (uVar1 - c_lev) + 1;
    pBVar14 = (BARef *)(long)c_lev;
    iVar18 = uVar1 + 1;
    if (init_vel_iter < 2) {
      init_vel_iter = 1;
    }
    iVar19 = iVar18 - c_lev;
    local_1e0 = (_Bit_type *)((long)pBVar14 * 8);
    local_2bc = 0;
    pBVar17 = pBVar14;
    local_224 = init_vel_iter;
    local_208 = piVar23;
    do {
      if (verbose != 0) {
        local_1c8._8_8_ = amrex::OutStream();
        local_1c8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_1c8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
        *(undefined8 *)
         ((long)&local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         (((BARef *)
          ((long)local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h._M_rehash_policy.
         _M_next_resize) =
             *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
        cVar8 = (char)(ostringstream *)&local_1b8;
        pBVar17 = (BARef *)local_1b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        std::ios::widen((char)(((BARef *)
                               ((long)local_1b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash).
                              _M_h._M_rehash_policy._M_next_resize + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"Projection::initialVelocityProject(): iteration ",0x30);
        std::ostream::operator<<((ostringstream *)&local_1b8,local_2bc);
        std::ios::widen((char)(((BARef *)
                               ((long)local_1b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash).
                              _M_h._M_rehash_policy._M_next_resize + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_1c8);
      }
      pBVar25 = pBVar14;
      iVar21 = iVar19;
      if (c_lev <= (int)piVar23) {
        do {
          pFVar2 = *(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1b0);
          pBVar17 = (BARef *)&(pFVar2->super_FabArrayBase).n_grow;
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,(IntVect *)pBVar17);
          iVar21 = iVar21 + -1;
          pBVar25 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                        *)&pBVar25->m_abox)->
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
        } while (iVar21 != 0);
      }
      bVar10 = OutFlowBC::HasOutFlowBC(this->phys_bc);
      bVar10 = (have_divu != 0 && bVar10) && do_outflow_bcs != 0;
      pPVar15 = (Print *)CONCAT71((int7)((ulong)pBVar17 >> 8),bVar10);
      uVar1 = CONCAT31(0,bVar10);
      if (c_lev <= (int)piVar23) {
        local_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288;
        local_1d0 = local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pBVar17 = pBVar14;
        do {
          puVar9 = local_220.
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (&(local_230._M_pi)->_vptr__Sp_counted_base)[(long)pBVar17] =
               *(_func_int ***)
                (*(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
                200);
          local_1d0[(long)pBVar17] =
               *(MultiFab **)
                (*(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
                0x1b0);
          ppAVar3 = (this->LevelData).
                    super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                    super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pAVar4 = ppAVar3[(long)pBVar17];
          this_00 = (MultiFab *)operator_new(0x180);
          local_1c8._0_8_ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1;
          local_1b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1c8._8_8_ = (ostream *)0x0;
          local_1b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          amrex::MultiFab::MultiFab
                    (this_00,&pAVar4->grids,&pAVar4->dmap,1,uVar1,(MFInfo *)local_1c8,
                     (FabFactory<amrex::FArrayBox> *)
                     (ppAVar3[(long)pBVar17]->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    );
          pMVar13 = (&puVar9->_M_t)[(long)pBVar17].
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
          (&puVar9->_M_t)[(long)pBVar17].
          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = this_00;
          if (pMVar13 != (MultiFab *)0x0) {
            (**(code **)((long)(pMVar13->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               _vptr_FabArrayBase + 8))();
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1b8);
          if (rho_wgt_vel_proj == 0) {
            pFVar2 = &((&(local_220.
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t)[(long)pBVar17].
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>;
            local_1c8[4] = bVar10;
            local_1c8._0_4_ = uVar1;
            local_1c8._5_3_ = 0;
            local_1c8._8_4_ = uVar1;
            pPVar15 = (Print *)local_1c8;
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar2,1.0,0,(pFVar2->super_FabArrayBase).n_comp,(IntVect *)local_1c8);
          }
          else {
            if (uVar1 != 0) {
              amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                        (*(FabArray<amrex::FArrayBox> **)
                          (*(long *)&((this->LevelData).
                                      super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                      .
                                      super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17]->
                                     state).
                                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                     .
                                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                          + 200),1e+200,3,1);
              uVar5._M_t.
              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
              super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                   (this->parent->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17]._M_t;
              lVar24 = *(long *)((long)uVar5._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                                + 0x170);
              pFVar6 = *(FabArrayBase **)(lVar24 + 200);
              TVar12 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar24 + 8));
              if (TVar12 == Point) {
                dVar27 = *(double *)(lVar24 + 0xb0);
              }
              else {
                dVar27 = (*(double *)(lVar24 + 0xa8) + *(double *)(lVar24 + 0xb0)) * 0.5;
              }
              amrex::MFIter::MFIter((MFIter *)local_1c8,pFVar6,'\0');
              while ((int)local_1b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1a0) {
                ppbVar16 = &local_1b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_188 != (long *)0x0) {
                  ppbVar16 = (pointer *)
                             ((long)(int)local_1b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 +
                             *local_188);
                }
                (**(code **)(*(long *)uVar5._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                            + 0xf0))
                          (dVar27,uVar5._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                           *(undefined8 *)
                            (*(long *)((long)&pFVar6[1].boxarray.m_bat.m_op + 0xc) +
                            (long)*(int *)ppbVar16 * 8),0,3,3,1);
                amrex::MFIter::operator++((MFIter *)local_1c8);
              }
              amrex::MFIter::~MFIter((MFIter *)local_1c8);
            }
            pPVar15 = (Print *)0x0;
            amrex::MultiFab::Copy
                      ((&(local_220.
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t)[(long)pBVar17].
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       *(MultiFab **)
                        (*(long *)&((this->LevelData).
                                    super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                    .
                                    super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17]->state)
                                   .
                                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                   .
                                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                        + 200),3,0,1,uVar1);
          }
          pBVar17 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                        *)&pBVar17->m_abox)->
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
        } while (iVar18 != (int)pBVar17);
      }
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::vector(&local_200,10,(allocator_type *)local_1c8);
      if (c_lev <= (int)local_208) {
        local_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288;
        pBVar17 = pBVar14;
        do {
          amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     (&(local_230._M_pi)->_vptr__Sp_counted_base)[(long)pBVar17],1e+200,0,3);
          uVar5._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
          _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->parent->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17]._M_t;
          lVar24 = *(long *)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                   .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                            0x170);
          pFVar6 = *(FabArrayBase **)(lVar24 + 200);
          TVar12 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar24 + 8));
          if (TVar12 == Point) {
            dVar27 = *(double *)(lVar24 + 0xb0);
          }
          else {
            dVar27 = (*(double *)(lVar24 + 0xa8) + *(double *)(lVar24 + 0xb0)) * 0.5;
          }
          amrex::MFIter::MFIter((MFIter *)local_1c8,pFVar6,'\0');
          while ((int)local_1b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1a0) {
            ppbVar16 = &local_1b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_188 != (long *)0x0) {
              ppbVar16 = (pointer *)
                         ((long)(int)local_1b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage * 4 +
                         *local_188);
            }
            pPVar15 = (Print *)0x0;
            (**(code **)(*(long *)uVar5._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                        0xf0))(dVar27,uVar5._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                               *(undefined8 *)
                                (*(long *)((long)&pFVar6[1].boxarray.m_bat.m_op + 0xc) +
                                (long)*(int *)ppbVar16 * 8),0,0,0,3);
            amrex::MFIter::operator++((MFIter *)local_1c8);
          }
          amrex::MFIter::~MFIter((MFIter *)local_1c8);
          if (have_divu != 0) {
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"divu","");
            bVar10 = amrex::AmrLevel::isStateVariable
                               ((string *)local_1c8,(int *)&local_2a8,(int *)&local_268);
            if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8._0_8_ != &local_1b8) {
              operator_delete((void *)local_1c8._0_8_,
                              (ulong)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                                *)&(local_1b8.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)->
                                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if (!bVar10) {
              amrex::Error_host("Projection::initialVelocityProject(): Divu not found");
            }
            pPVar15 = (Print *)0x0;
            this_01 = (NavierStokesBase *)
                      __dynamic_cast((this->LevelData).
                                     super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                     .
                                     super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)pBVar17],
                                     &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
            lVar24 = CONCAT71(local_200.
                              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_200.
                              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
            pMVar13 = NavierStokesBase::getDivCond(this_01,uVar1,local_1d8);
            plVar7 = *(long **)(lVar24 + (long)pBVar17 * 8);
            *(MultiFab **)(lVar24 + (long)pBVar17 * 8) = pMVar13;
            if (plVar7 != (long *)0x0) {
              (**(code **)(*plVar7 + 8))();
            }
          }
          pBVar17 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                        *)&pBVar17->m_abox)->
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
        } while (iVar18 != (int)pBVar17);
      }
      bVar10 = OutFlowBC::HasOutFlowBC(this->phys_bc);
      piVar23 = local_208;
      pMVar13 = (MultiFab *)CONCAT71((int7)((ulong)pPVar15 >> 8),do_outflow_bcs != 0);
      iVar21 = (int)local_208;
      uVar20 = extraout_RDX;
      if ((have_divu != 0) && (bVar10 && do_outflow_bcs != 0)) {
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1c8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_200);
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  (&local_2a8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_220);
        pMVar13 = (MultiFab *)local_288;
        set_outflow_bcs(this,0x3ea,&local_248,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar13,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1c8,
                        &local_2a8,c_lev,iVar21,have_divu);
        uVar20 = extraout_RDX_00;
        if (local_2a8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a8.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_2a8.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a8.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar20 = extraout_RDX_01;
        }
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8._0_8_ !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          operator_delete((void *)local_1c8._0_8_,
                          (long)local_1b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - local_1c8._0_8_);
          uVar20 = extraout_RDX_02;
        }
      }
      pBVar17 = pBVar14;
      if (c_lev <= iVar21) {
        do {
          scaleVar(this,(&(local_220.
                           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t)[(long)pBVar17].
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(int)uVar20,
                   pMVar13,(int)pBVar17);
          pBVar17 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                        *)&pBVar17->m_abox)->
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
          uVar20 = extraout_RDX_03;
        } while (iVar18 != (int)pBVar17);
      }
      if (have_divu == 0) {
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1c8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_220);
        local_2a8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pBVar17 = (BARef *)local_288;
        doMLMGNodalProjection
                  (this,c_lev,iVar11,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pBVar17,
                   &local_248,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1c8,
                   &local_2a8,&local_268,proj_tol,proj_abs_tol,false,(MultiFab *)0x0,(MultiFab *)0x0
                   ,false);
        uVar20 = extraout_RDX_05;
      }
      else {
        pBVar17 = pBVar14;
        iVar22 = iVar19;
        if (c_lev <= iVar21) {
          do {
            amrex::MultiFab::mult
                      (*(MultiFab **)
                        (CONCAT71(local_200.
                                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_200.
                                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                        (long)pBVar17 * 8),-1.0,0,1,uVar1);
            pBVar17 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                          *)&pBVar17->m_abox)->
                                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
        }
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1c8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_220);
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  (&local_2a8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_200);
        local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pBVar17 = (BARef *)local_288;
        doMLMGNodalProjection
                  (this,c_lev,iVar11,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pBVar17,
                   &local_248,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1c8,
                   &local_2a8,&local_268,proj_tol,proj_abs_tol,false,(MultiFab *)0x0,(MultiFab *)0x0
                   ,false);
        uVar20 = extraout_RDX_04;
      }
      if (local_268.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_268.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        uVar20 = extraout_RDX_06;
      }
      if (local_2a8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a8.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        uVar20 = extraout_RDX_07;
      }
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1c8._0_8_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        operator_delete((void *)local_1c8._0_8_,
                        (long)local_1b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - local_1c8._0_8_);
        uVar20 = extraout_RDX_08;
      }
      pBVar25 = pBVar14;
      if (c_lev <= iVar21) {
        do {
          rescaleVar(this,(&(local_220.
                             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t)[(long)pBVar25].
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(int)uVar20,
                     (MultiFab *)pBVar17,(int)pBVar25);
          pBVar25 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                        *)&pBVar25->m_abox)->
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
          uVar20 = extraout_RDX_09;
        } while (iVar18 != (int)pBVar25);
      }
      pBVar25 = pBVar14;
      iVar22 = iVar19;
      if (c_lev <= iVar21) {
        do {
          pFVar2 = *(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1b0);
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,
                     &(pFVar2->super_FabArrayBase).n_grow);
          pFVar2 = *(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1a8);
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,
                     &(pFVar2->super_FabArrayBase).n_grow);
          pFVar2 = *(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x290);
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,
                     &(pFVar2->super_FabArrayBase).n_grow);
          pFVar2 = *(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pBVar25]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x288);
          pBVar17 = (BARef *)&(pFVar2->super_FabArrayBase).n_grow;
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar2,0.0,0,(pFVar2->super_FabArrayBase).n_comp,(IntVect *)pBVar17);
          pBVar25 = (BARef *)((long)&(((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                        *)&pBVar25->m_abox)->
                                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      if (verbose != 0) {
        local_1c8._8_8_ = amrex::OutStream();
        local_1c8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_1c8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
        pBVar17 = (BARef *)(((BARef *)
                            ((long)local_1b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h.
                           _M_rehash_policy._M_next_resize;
        *(undefined8 *)
         ((long)&local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + (long)pBVar17) =
             *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"After nodal projection:",0x17);
        std::ios::widen((char)(((BARef *)
                               ((long)local_1b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash).
                              _M_h._M_rehash_policy._M_next_resize + (char)&local_1b8);
        std::ostream::put((char)&local_1b8);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_1c8);
        if (c_lev <= iVar21) {
          puVar26 = (undefined8 *)((long)((IntVect *)local_288)->vect + (long)local_1e0);
          iVar21 = c_lev;
          do {
            local_1c8._8_8_ = amrex::OutStream();
            local_1c8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
            local_1c8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
            *(undefined8 *)
             ((long)&local_1b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
             (((BARef *)
              ((long)local_1b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h.
             _M_rehash_policy._M_next_resize) =
                 *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"  lev ",6);
            std::ostream::operator<<((ostringstream *)&local_1b8,iVar21);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b8,"max(abs(u,v,w)) = ",0x12);
            RVar28 = amrex::MultiFab::norm0((MultiFab *)*puVar26,0,0,false,true);
            std::ostream::_M_insert<double>(RVar28);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8," ",1);
            RVar28 = amrex::MultiFab::norm0((MultiFab *)*puVar26,1,0,false,true);
            std::ostream::_M_insert<double>(RVar28);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8," ",1);
            pBVar17 = (BARef *)0x0;
            RVar28 = amrex::MultiFab::norm0((MultiFab *)*puVar26,2,0,false,true);
            std::ostream::_M_insert<double>(RVar28);
            cVar8 = (char)(ostringstream *)&local_1b8;
            std::ios::widen((char)(((BARef *)
                                   ((long)local_1b8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)
                                  ._M_h._M_rehash_policy._M_next_resize + cVar8);
            std::ostream::put(cVar8);
            std::ostream::flush();
            amrex::Print::~Print((Print *)local_1c8);
            iVar21 = iVar21 + 1;
            puVar26 = puVar26 + 1;
          } while (iVar18 != iVar21);
        }
      }
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::~vector(&local_200);
      local_2bc = local_2bc + 1;
    } while (local_2bc != local_224);
    if (verbose != 0) {
      dVar27 = amrex::ParallelDescriptor::second();
      local_1c8._8_8_ = amrex::OutStream();
      local_1c8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_1c8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
      *(undefined8 *)
       ((long)&local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       (((BARef *)
        ((long)local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -0x80))->hash)._M_h._M_rehash_policy.
       _M_next_resize) =
           *(undefined8 *)(local_1c8._8_8_ + *(long *)(*(long *)local_1c8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8,"Projection::initialVelocityProject(): time: ",0x2c);
      std::ostream::_M_insert<double>(dVar27 - local_1e8);
      local_200.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,(char *)&local_200,1)
      ;
      amrex::Print::~Print((Print *)local_1c8);
    }
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::~vector(&local_220);
    if (local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_288 != (undefined1  [8])0x0) {
      operator_delete((void *)local_288,local_278 - (long)local_288);
    }
  }
  return;
}

Assistant:

void
Projection::initialVelocityProject (int  c_lev,
                                    Real cur_divu_time,
                                    int  have_divu,
                                    int init_vel_iter )
{
    int lev;
    int f_lev = parent->finestLevel();

    if ( init_vel_iter <= 0 ){
      // Make sure P_old is initialized
      for (lev = c_lev; lev <= f_lev; lev++)
      {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
      }
      
      if ( verbose ) Print()<<"Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n";
      return;
    }

    if (verbose)
    {
        amrex::Print() << "Projection::initialVelocityProject(): levels = " << c_lev
                       << "-" << f_lev << '\n';
        if (rho_wgt_vel_proj)
            amrex::Print() << "RHO WEIGHTED INITIAL VELOCITY PROJECTION\n";
        else
            amrex::Print() << "CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n";
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);
    Vector<std::unique_ptr<MultiFab> > sig(maxlev);

    for (int iter = 0; iter < init_vel_iter; ++iter)
    {
        if (verbose)
        {
            amrex::Print() << std::endl
                           << "Projection::initialVelocityProject(): iteration "
                           << iter
                           << std::endl;
        }

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.0);
        }

	// MLNodeLaplacian does not take any ghost cells from rhcc or sig.
	// copies only valid cells and fills ghosts internally.
	// However, vel and phi are assumed to have 1 ghost cell in MLMG.
	// set outflow bcs fills vel and phi using 1 ghost cell from sig (holding rho)
	// and rhcc (holding divu)
	const int nghost =
	  (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu) ? 1 : 0;

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
            phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));

            const BoxArray& grids  = LevelData[lev]->boxArray();
            const DistributionMapping& dmap = LevelData[lev]->DistributionMap();
            sig[lev].reset(new MultiFab(grids,dmap,1,nghost,MFInfo(),LevelData[lev]->Factory()));

            if (rho_wgt_vel_proj)
            {
	      if ( nghost > 0 ){
                LevelData[lev]->get_new_data(State_Type).setBndry(BogusValue,Density,1);

                AmrLevel& amr_level = parent->getLevel(lev);

                MultiFab& S_new = amr_level.get_new_data(State_Type);

                Real curr_time = amr_level.get_state_data(State_Type).curTime();

                for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
                {
                    amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,
                                                    Density,Density,1);
                }
	      }

	      MultiFab::Copy(*sig[lev],
			     LevelData[lev]->get_new_data(State_Type),
			     Density, 0, 1, nghost);
            }
            else
            {
                sig[lev]->setVal(1.,nghost);
            }
        }

        Vector<std::unique_ptr<MultiFab> > rhcc(maxlev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
            //
            // Set the physical boundary values.
            //
            AmrLevel& amr_level = parent->getLevel(lev);

            MultiFab& S_new = amr_level.get_new_data(State_Type);

            Real curr_time = amr_level.get_state_data(State_Type).curTime();

            for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
            }

            if (have_divu)
            {
                int Divu_Type, Divu;
                if (!LevelData[lev]->isStateVariable("divu", Divu_Type, Divu))
		  amrex::Error("Projection::initialVelocityProject(): Divu not found");

		NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev]);
		AMREX_ASSERT(!(ns == 0));

		rhcc[lev].reset(ns->getDivCond(nghost,cur_divu_time));
            }
        }

        if (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu)
        {
            set_outflow_bcs(INITIAL_VEL,phi,vel,
                            amrex::GetVecOfPtrs(rhcc),
                            amrex::GetVecOfPtrs(sig),
                            c_lev,f_lev,have_divu);
        }

        //
        // Scale the projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            scaleVar(sig[lev].get(),nghost,vel[lev],lev);
        }

        //
        // Project
        //
        //

        bool increment_gp = false;
        if (!have_divu)
        {
            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  {},
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }
        else
        {
            for (lev = c_lev; lev <= f_lev; lev++)
            {
                if (parent->Geom(0).IsRZ()) radMultScal(lev,*rhcc[lev]);
                rhcc[lev]->mult(-1.0,0,1,nghost);
            }

            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  amrex::GetVecOfPtrs(rhcc),
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }

        //
        // Unscale initial projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
            rescaleVar(sig[lev].get(),nghost,vel[lev],lev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_new_data(Press_Type).setVal(0.);

            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
            LevelData[lev]->get_new_data(Gradp_Type).setVal(0.);
        }

        if (verbose)
        {
            amrex::Print() << "After nodal projection:" << std::endl;
            for (lev = c_lev; lev <= f_lev; ++lev)
            {
                amrex::Print() << "  lev " << lev << ": "
#if (AMREX_SPACEDIM==3)
                               << "max(abs(u,v,w)) = "
#else
                               << "max(abs(u,v)) = "
#endif
                               << vel[lev]->norm0(0,0,false,true) << " "
                               << vel[lev]->norm0(1,0,false,true) << " "
#if (AMREX_SPACEDIM==3)
                               << vel[lev]->norm0(2,0,false,true)
#endif
                               << std::endl;
            }
        }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::initialVelocityProject(): time: " << run_time << '\n';
    }
}